

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O2

mmt_buf * find_ptr(uint64_t ptr,mmt_memory_dump *args,int argc)

{
  long lVar1;
  mmt_buf *pmVar2;
  mmt_buf *pmVar3;
  long lVar4;
  
  pmVar2 = (mmt_buf *)0x0;
  if (ptr != 0) {
    pmVar3 = (mmt_buf *)(ulong)(uint)argc;
    if (argc < 1) {
      pmVar3 = pmVar2;
    }
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      if ((long)pmVar3 * 0x18 + 0x18 == lVar4 + 0x18) {
        return (mmt_buf *)0x0;
      }
      lVar1 = lVar4 + 0x18;
    } while (*(uint64_t *)((long)&args->addr + lVar4) != ptr);
    pmVar2 = *(mmt_buf **)((long)&args->data + lVar4);
  }
  return pmVar2;
}

Assistant:

struct mmt_buf *find_ptr(uint64_t ptr, struct mmt_memory_dump *args, int argc)
{
	int i;
	if (!ptr)
		return NULL;
	for (i = 0; i < argc; ++i)
		if (args[i].addr == ptr)
			return args[i].data;

	return NULL;
}